

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

bool kratos::has_port_type(Var *var,PortType type)

{
  bool bVar1;
  VarType VVar2;
  PortType PVar3;
  VarCastType VVar4;
  bool local_41;
  VarCasted *casted;
  Port *p;
  bool r;
  bool l;
  Expr *expr;
  PortType type_local;
  Var *var_local;
  
  VVar2 = Var::type(var);
  if (VVar2 == Expression) {
    var_local._7_1_ =
         has_port_type((Var *)var[1].super_IRNode.fn_name_ln.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,type);
    if (var[1].super_IRNode.fn_name_ln.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      bVar1 = has_port_type((Var *)var[1].super_IRNode.fn_name_ln.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,type);
      local_41 = false;
      if (var_local._7_1_) {
        local_41 = bVar1;
      }
      var_local._7_1_ = local_41;
    }
  }
  else {
    VVar2 = Var::type(var);
    if (VVar2 == PortIO) {
      PVar3 = Port::port_type((Port *)var);
      var_local._7_1_ = PVar3 == type;
    }
    else {
      VVar2 = Var::type(var);
      if (VVar2 == BaseCasted) {
        if (type == AsyncReset) {
          VVar4 = VarCasted::cast_type((VarCasted *)var);
          return VVar4 == AsyncReset;
        }
        if (type == ClockEnable) {
          VVar4 = VarCasted::cast_type((VarCasted *)var);
          return VVar4 == ClockEnable;
        }
        if (type == Clock) {
          VVar4 = VarCasted::cast_type((VarCasted *)var);
          return VVar4 == Clock;
        }
      }
      var_local._7_1_ = false;
    }
  }
  return var_local._7_1_;
}

Assistant:

bool static has_port_type(Var* var, PortType type) {
    if (var->type() == VarType::Expression) {
        auto* expr = reinterpret_cast<Expr*>(var);
        auto l = has_port_type(expr->left, type);
        if (expr->right) {
            auto r = has_port_type(expr->right, type);
            return l && r;
        }
        return l;
    }
    if (var->type() == VarType::PortIO) {
        auto* p = reinterpret_cast<Port*>(var);
        return p->port_type() == type;
    } else if (var->type() == VarType::BaseCasted) {
        auto* casted = reinterpret_cast<VarCasted*>(var);
        if (type == PortType::AsyncReset)
            return casted->cast_type() == VarCastType::AsyncReset;
        else if (type == PortType::ClockEnable)
            return casted->cast_type() == VarCastType::ClockEnable;
        else if (type == PortType::Clock)
            return casted->cast_type() == VarCastType::Clock;
    }
    return false;
}